

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_fast_fourier_transform.cc
# Opt level: O2

bool __thiscall
sptk::InverseFastFourierTransform::Run
          (InverseFastFourierTransform *this,
          vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *imag_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output)

{
  int iVar1;
  pointer pdVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  
  bVar3 = FastFourierTransform::Run
                    (&this->fast_fourier_transform_,imag_part_input,real_part_input,imag_part_output
                     ,real_part_output);
  if (bVar3) {
    iVar1 = (this->fast_fourier_transform_).fft_length_;
    dVar6 = 1.0 / (double)iVar1;
    pdVar2 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)iVar1 * 8;
    for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 8) {
      *(double *)((long)pdVar2 + lVar5) = *(double *)((long)pdVar2 + lVar5) * dVar6;
    }
    pdVar2 = (imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 8) {
      *(double *)((long)pdVar2 + lVar5) = *(double *)((long)pdVar2 + lVar5) * dVar6;
    }
  }
  return bVar3;
}

Assistant:

bool InverseFastFourierTransform::Run(
    const std::vector<double>& real_part_input,
    const std::vector<double>& imag_part_input,
    std::vector<double>* real_part_output,
    std::vector<double>* imag_part_output) const {
  if (!fast_fourier_transform_.Run(imag_part_input, real_part_input,
                                   imag_part_output, real_part_output)) {
    return false;
  }

  const int fft_length(fast_fourier_transform_.GetFftLength());
  const double z(1.0 / fft_length);
  std::transform(real_part_output->begin(),
                 real_part_output->begin() + fft_length,
                 real_part_output->begin(), [z](double x) { return x * z; });
  std::transform(imag_part_output->begin(),
                 imag_part_output->begin() + fft_length,
                 imag_part_output->begin(), [z](double x) { return x * z; });

  return true;
}